

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O1

bool __thiscall
Minisat::SimpSolver::merge
          (SimpSolver *this,Clause *_ps,Clause *_qs,Var v,vec<Minisat::Lit,_int> *out_clause)

{
  anon_struct_4_5_613047fb_for_header aVar1;
  undefined8 in_RAX;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  anon_struct_4_5_613047fb_for_header *paVar5;
  bool bVar6;
  bool bVar7;
  undefined8 local_38;
  
  this->merges = this->merges + 1;
  if (out_clause->data != (Lit *)0x0) {
    out_clause->sz = 0;
  }
  paVar5 = &_qs->header;
  if ((uint)_ps->header >> 5 < (uint)_qs->header >> 5) {
    paVar5 = &_ps->header;
    _ps = _qs;
  }
  bVar6 = (uint)*paVar5 < 0x20;
  local_38 = in_RAX;
  if (!bVar6) {
    uVar4 = 0;
    do {
      aVar1 = paVar5[uVar4 + 1];
      if ((int)aVar1 >> 1 != v) {
        uVar3 = 5;
        if (0x1f < (uint)_ps->header) {
          uVar2 = 0;
          do {
            if ((int)(&_ps->header)[uVar2 + 1] >> 1 == (int)aVar1 >> 1) {
              uVar3 = (uint)(&_ps->header)[uVar2 + 1] ^ (uint)aVar1;
              if (uVar3 != 1) {
                uVar3 = 8;
              }
              break;
            }
            uVar2 = uVar2 + 1;
          } while ((uint)_ps->header >> 5 != uVar2);
        }
        if (uVar3 != 8) {
          if (uVar3 != 5) {
            return bVar6;
          }
          local_38 = CONCAT44(aVar1,local_38._0_4_);
          vec<Minisat::Lit,_int>::push(out_clause,(Lit *)((long)&local_38 + 4));
        }
      }
      uVar4 = uVar4 + 1;
      bVar7 = uVar4 < (uint)*paVar5 >> 5;
      bVar6 = !bVar7;
    } while (bVar7);
  }
  if (0x1f < (uint)_ps->header) {
    uVar4 = 0;
    do {
      if ((int)(&_ps->header)[uVar4 + 1] >> 1 != v) {
        local_38 = CONCAT44(local_38._4_4_,(&_ps->header)[uVar4 + 1]);
        vec<Minisat::Lit,_int>::push(out_clause,(Lit *)&local_38);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 < (uint)_ps->header >> 5);
  }
  return bVar6;
}

Assistant:

bool SimpSolver::merge(const Clause& _ps, const Clause& _qs, Var v, vec<Lit>& out_clause)
{
    merges++;
    out_clause.clear();

    bool  ps_smallest = _ps.size() < _qs.size();
    const Clause& ps  =  ps_smallest ? _qs : _ps;
    const Clause& qs  =  ps_smallest ? _ps : _qs;

    for (int i = 0; i < qs.size(); i++){
        if (var(qs[i]) != v){
            for (int j = 0; j < ps.size(); j++)
                if (var(ps[j]) == var(qs[i])){
                    if (ps[j] == ~qs[i])
                        return false;
                    else
                        goto next;
                }
            out_clause.push(qs[i]);
        }
        next:;
    }

    for (int i = 0; i < ps.size(); i++)
        if (var(ps[i]) != v)
            out_clause.push(ps[i]);

    return true;
}